

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imleInline.hpp
# Opt level: O0

void __thiscall IMLE::clusterInverseSolutions(IMLE *this,int newSol1,int newSol2,int worseSol)

{
  reference pFVar1;
  reference index;
  int in_EDX;
  int in_ESI;
  long in_RDI;
  double dVar2;
  Scalar SVar3;
  int j_1;
  int k_3;
  int k_2;
  Scal pSum;
  Z dist;
  int k_1;
  int j;
  int nIter;
  int k;
  ArrayZZ sum_invRp;
  Mat sol;
  Mat p;
  DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *in_stack_fffffffffffffb58;
  DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *in_stack_fffffffffffffb60;
  NoAlias<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_Eigen::MatrixBase>
  in_stack_fffffffffffffb68;
  DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *in_stack_fffffffffffffb70;
  Inverse<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> in_stack_fffffffffffffb78;
  MatrixBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>
  *in_stack_fffffffffffffb80;
  MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *in_stack_fffffffffffffb88;
  DenseBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>_>
  *in_stack_fffffffffffffb90;
  Scalar *in_stack_fffffffffffffbb0;
  MatrixBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *in_stack_fffffffffffffbb8;
  int local_38c;
  int local_27c;
  int local_24c;
  int local_12c;
  int local_128;
  int local_124;
  int local_78;
  vector<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
  local_70 [4];
  int local_10;
  int local_c;
  
  local_10 = in_EDX;
  local_c = in_ESI;
  Eigen::Matrix<double,-1,-1,0,-1,-1>::Matrix<int,int>
            ((Matrix<double,__1,__1,_0,__1,__1> *)in_stack_fffffffffffffb80,
             (int *)in_stack_fffffffffffffb78.m_xpr,(int *)in_stack_fffffffffffffb70);
  Eigen::Matrix<double,-1,-1,0,-1,-1>::Matrix<int,int>
            ((Matrix<double,__1,__1,_0,__1,__1> *)in_stack_fffffffffffffb80,
             (int *)in_stack_fffffffffffffb78.m_xpr,(int *)in_stack_fffffffffffffb70);
  std::allocator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::allocator
            ((allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)0x300223);
  std::
  vector<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>
  ::vector((vector<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
            *)in_stack_fffffffffffffb80,(size_type)in_stack_fffffffffffffb78.m_xpr,
           (value_type *)in_stack_fffffffffffffb70,
           (allocator_type *)in_stack_fffffffffffffb68.m_expression);
  std::allocator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::~allocator
            ((allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)0x300257);
  for (local_78 = 0; local_78 < *(int *)(in_RDI + 0x358) + -1; local_78 = local_78 + 1) {
    std::
    vector<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
    ::operator[]((vector<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                  *)(in_RDI + 0x310),(long)local_78);
    Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::col
              (in_stack_fffffffffffffb70,(Index)in_stack_fffffffffffffb68.m_expression);
    Eigen::Block<Eigen::Matrix<double,-1,-1,0,-1,-1>,-1,1,true>::operator=
              ((Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true> *)
               in_stack_fffffffffffffb60,in_stack_fffffffffffffb58);
  }
  pFVar1 = std::vector<FastLinearExpert,_Eigen::aligned_allocator_indirection<FastLinearExpert>_>::
           operator[]((vector<FastLinearExpert,_Eigen::aligned_allocator_indirection<FastLinearExpert>_>
                       *)(in_RDI + 0xb0),(long)local_c);
  LinearExpert::getPredZ(&pFVar1->super_LinearExpert);
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::col
            (in_stack_fffffffffffffb70,(Index)in_stack_fffffffffffffb68.m_expression);
  Eigen::Block<Eigen::Matrix<double,-1,-1,0,-1,-1>,-1,1,true>::operator=
            ((Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true> *)
             in_stack_fffffffffffffb60,in_stack_fffffffffffffb58);
  pFVar1 = std::vector<FastLinearExpert,_Eigen::aligned_allocator_indirection<FastLinearExpert>_>::
           operator[]((vector<FastLinearExpert,_Eigen::aligned_allocator_indirection<FastLinearExpert>_>
                       *)(in_RDI + 0xb0),(long)local_10);
  LinearExpert::getPredZ(&pFVar1->super_LinearExpert);
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::col
            (in_stack_fffffffffffffb70,(Index)in_stack_fffffffffffffb68.m_expression);
  Eigen::Block<Eigen::Matrix<double,-1,-1,0,-1,-1>,-1,1,true>::operator=
            ((Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true> *)
             in_stack_fffffffffffffb60,in_stack_fffffffffffffb58);
  for (local_124 = 0; local_124 < *(int *)(in_RDI + 0x88); local_124 = local_124 + 1) {
    for (local_128 = 0; local_128 < *(int *)(in_RDI + 200); local_128 = local_128 + 1) {
      for (local_12c = 0; local_12c < *(int *)(in_RDI + 0x358); local_12c = local_12c + 1) {
        pFVar1 = std::
                 vector<FastLinearExpert,_Eigen::aligned_allocator_indirection<FastLinearExpert>_>::
                 operator[]((vector<FastLinearExpert,_Eigen::aligned_allocator_indirection<FastLinearExpert>_>
                             *)(in_RDI + 0xb0),(long)local_128);
        LinearExpert::getPredZ(&pFVar1->super_LinearExpert);
        Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::col
                  (in_stack_fffffffffffffb70,(Index)in_stack_fffffffffffffb68.m_expression);
        Eigen::MatrixBase<Eigen::Matrix<double,-1,1,0,-1,1>>::operator-
                  (in_stack_fffffffffffffb88,in_stack_fffffffffffffb80);
        Eigen::Matrix<double,-1,1,0,-1,1>::
        Matrix<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,_1,1,0,_1,1>const,Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,_1,1,true>const>>
                  ((Matrix<double,__1,_1,_0,__1,_1> *)in_stack_fffffffffffffb60,
                   (EigenBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>_>
                    *)in_stack_fffffffffffffb58);
        std::
        vector<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>
        ::operator[]((vector<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                      *)(in_RDI + 0x2a8),(long)local_128);
        Eigen::MatrixBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::operator*
                  ((MatrixBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)
                   in_stack_fffffffffffffb60,
                   (MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)in_stack_fffffffffffffb58)
        ;
        in_stack_fffffffffffffbb8 =
             (MatrixBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)
             Eigen::MatrixBase<Eigen::Matrix<double,-1,1,0,-1,1>>::
             dot<Eigen::Product<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Matrix<double,_1,1,0,_1,1>,0>>
                       ((MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)
                        in_stack_fffffffffffffb60,
                        (MatrixBase<Eigen::Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>_>
                         *)in_stack_fffffffffffffb58);
        dVar2 = exp(((double)in_stack_fffffffffffffbb8 * -0.5) / *(double *)(in_RDI + 0x1b8));
        in_stack_fffffffffffffbb0 =
             Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)
                        in_stack_fffffffffffffb60,(Index)in_stack_fffffffffffffb58,0x300609);
        *in_stack_fffffffffffffbb0 = dVar2;
        Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix((Matrix<double,__1,_1,_0,__1,_1> *)0x30062c)
        ;
      }
      Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::row
                (in_stack_fffffffffffffb70,(Index)in_stack_fffffffffffffb68.m_expression);
      SVar3 = Eigen::
              DenseBase<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1,_-1,_false>_>::sum
                        ((DenseBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>_>
                          *)in_stack_fffffffffffffb68.m_expression);
      if (0.0 < SVar3) {
        Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::row
                  (in_stack_fffffffffffffb70,(Index)in_stack_fffffffffffffb68.m_expression);
        Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1,_-1,_false>_>::
        operator/=(in_stack_fffffffffffffb90,(Scalar *)in_stack_fffffffffffffb88);
      }
      for (local_24c = 0; local_24c < *(int *)(in_RDI + 0x358); local_24c = local_24c + 1) {
        std::
        vector<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>
        ::operator[]((vector<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                      *)(in_RDI + 0x2a8),(long)local_128);
        in_stack_fffffffffffffb90 =
             (DenseBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>_> *)
             Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)
                        in_stack_fffffffffffffb60,(Index)in_stack_fffffffffffffb58,0x300758);
        Eigen::MatrixBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::operator*
                  (in_stack_fffffffffffffbb8,in_stack_fffffffffffffbb0);
        in_stack_fffffffffffffb88 =
             (MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)
             std::
             vector<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>
             ::operator[](local_70,(long)local_24c);
        Eigen::MatrixBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::operator+=
                  ((MatrixBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)
                   in_stack_fffffffffffffb80,
                   (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>_>
                    *)in_stack_fffffffffffffb78.m_xpr);
      }
    }
    for (local_27c = 0; local_27c < *(int *)(in_RDI + 0x358); local_27c = local_27c + 1) {
      in_stack_fffffffffffffb80 =
           (MatrixBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_> *)
           std::
           vector<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>
           ::operator[](local_70,(long)local_27c);
      in_stack_fffffffffffffb78 =
           Eigen::MatrixBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::inverse
                     ((MatrixBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)
                      in_stack_fffffffffffffb58);
      in_stack_fffffffffffffb70 =
           (DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)(in_RDI + 0x2c0);
      Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::col
                (in_stack_fffffffffffffb70,(Index)in_stack_fffffffffffffb68.m_expression);
      Eigen::MatrixBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::operator*
                ((MatrixBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)in_stack_fffffffffffffb70,
                 (MatrixBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_> *
                 )in_stack_fffffffffffffb68.m_expression);
      Eigen::MatrixBase<Eigen::Inverse<Eigen::Matrix<double,-1,-1,0,-1,-1>>>::operator*
                ((MatrixBase<Eigen::Inverse<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_> *)
                 in_stack_fffffffffffffb70,
                 (MatrixBase<Eigen::Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_0>_>
                  *)in_stack_fffffffffffffb68.m_expression);
      Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::col
                (in_stack_fffffffffffffb70,(Index)in_stack_fffffffffffffb68.m_expression);
      in_stack_fffffffffffffb68 =
           Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_1,_true>_>::
           noalias((MatrixBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>
                    *)in_stack_fffffffffffffb58);
      Eigen::NoAlias<Eigen::Block<Eigen::Matrix<double,-1,-1,0,-1,-1>,-1,1,true>,Eigen::MatrixBase>
      ::operator=((NoAlias<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_Eigen::MatrixBase>
                   *)in_stack_fffffffffffffb80,
                  (MatrixBase<Eigen::Product<Eigen::Inverse<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_Eigen::Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_0>,_0>_>
                   *)in_stack_fffffffffffffb78.m_xpr);
      in_stack_fffffffffffffb60 =
           (DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)
           std::
           vector<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>
           ::operator[](local_70,(long)local_27c);
      Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::setZero
                (in_stack_fffffffffffffb60);
    }
  }
  for (local_38c = 0; local_38c < *(int *)(in_RDI + 200); local_38c = local_38c + 1) {
    Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::row
              (in_stack_fffffffffffffb70,(Index)in_stack_fffffffffffffb68.m_expression);
    index = std::vector<int,_std::allocator<int>_>::operator[]
                      ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x290),(long)local_38c);
    Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1,_-1,_false>_>::
    maxCoeff<int>((DenseBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>_>
                   *)in_stack_fffffffffffffb60,index);
  }
  std::
  vector<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>
  ::~vector((vector<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
             *)in_stack_fffffffffffffb80);
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix((Matrix<double,__1,__1,_0,__1,__1> *)0x3009fb);
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix((Matrix<double,__1,__1,_0,__1,__1> *)0x300a0a);
  return;
}

Assistant:

IMLE_CLASS_TEMPLATE
void IMLE_base::clusterInverseSolutions(int newSol1, int newSol2, int worseSol)
{
    Mat p(M,nInvSolFound);
    Mat sol(d,nInvSolFound);
    ArrayZZ sum_invRp(nInvSolFound, zeroZZ);

    // "Educated" guesses for the nInvSolFound solutions
    for(int k = 0; k < nInvSolFound-1; k++)
        sol.col(k) = invPredictions[k];
    // Split worse solution in two
    sol.col(worseSol)    = experts[newSol1].getPredZ();
    sol.col(nInvSolFound-1) = experts[newSol2].getPredZ();

    for( int nIter = 0; nIter < param.iterMax; nIter++ )
    {
        // E-Step
        for( int j = 0; j < M; j++ )
        {
            for( int k = 0; k < nInvSolFound; k++ )
            {
                Z dist = experts[j].getPredZ() - sol.col(k);
                p(j,k) = exp(-0.5*dist.dot(iInvRj[j]*dist)/sumAll);
            }
            Scal pSum;
            if( (pSum = p.row(j).sum()) > 0.0 )
                p.row(j) /= pSum;

            for( int k = 0; k < nInvSolFound; k++ )
                sum_invRp[k] += iInvRj[j] * p(j,k);
        }
        // M-Step
        for( int k = 0; k < nInvSolFound; k++ )
        {
            /* Here I can easily implement k-means by hard assigning to most probable solution */
            sol.col(k).noalias() = sum_invRp[k].inverse() * (invRzj * p.col(k));

            // Cleaning aux variable
            sum_invRp[k].setZero();
        }
    }

    // Hard assign solutions
    for( int j = 0; j < M; j++ )
        p.row(j).maxCoeff(&sNearestInv[j]);
}